

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

void * rar_read_ahead(archive_read *a,size_t min,ssize_t *avail)

{
  uint *puVar1;
  int local_3c;
  int ret;
  void *h;
  rar *rar;
  ssize_t *avail_local;
  size_t min_local;
  archive_read *a_local;
  
  puVar1 = (uint *)a->format->data;
  a_local = (archive_read *)__archive_read_ahead(a,min,avail);
  if (avail != (ssize_t *)0x0) {
    if (((a->archive).read_data_is_posix_read != '\0') &&
       ((long)(a->archive).read_data_requested < *avail)) {
      *avail = (a->archive).read_data_requested;
    }
    if (*(long *)(puVar1 + 0x2a) < *avail) {
      *avail = *(ssize_t *)(puVar1 + 0x2a);
    }
    if (*avail < 0) {
      a_local = (archive_read *)0x0;
    }
    else if (((*avail == 0) && ((*puVar1 & 1) != 0)) && ((puVar1[6] & 2) != 0)) {
      *(undefined1 *)(puVar1 + 0x44) = 1;
      local_3c = archive_read_format_rar_read_header(a,a->entry);
      if (local_3c == 1) {
        *(undefined1 *)(puVar1 + 0x3f) = 1;
        local_3c = archive_read_format_rar_read_header(a,a->entry);
      }
      *(undefined1 *)(puVar1 + 0x44) = 0;
      if (local_3c == 0) {
        a_local = (archive_read *)rar_read_ahead(a,min,avail);
      }
      else {
        a_local = (archive_read *)0x0;
      }
    }
  }
  return a_local;
}

Assistant:

static const void *
rar_read_ahead(struct archive_read *a, size_t min, ssize_t *avail)
{
  struct rar *rar = (struct rar *)(a->format->data);
  const void *h = __archive_read_ahead(a, min, avail);
  int ret;
  if (avail)
  {
    if (a->archive.read_data_is_posix_read && *avail > (ssize_t)a->archive.read_data_requested)
      *avail = a->archive.read_data_requested;
    if (*avail > rar->bytes_remaining)
      *avail = (ssize_t)rar->bytes_remaining;
    if (*avail < 0)
      return NULL;
    else if (*avail == 0 && rar->main_flags & MHD_VOLUME &&
      rar->file_flags & FHD_SPLIT_AFTER)
    {
      rar->filename_must_match = 1;
      ret = archive_read_format_rar_read_header(a, a->entry);
      if (ret == (ARCHIVE_EOF))
      {
        rar->has_endarc_header = 1;
        ret = archive_read_format_rar_read_header(a, a->entry);
      }
      rar->filename_must_match = 0;
      if (ret != (ARCHIVE_OK))
        return NULL;
      return rar_read_ahead(a, min, avail);
    }
  }
  return h;
}